

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O3

int coda_mem_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  coda_backend cVar1;
  int iVar2;
  int iVar3;
  coda_cursor sub_cursor;
  coda_cursor cStack_328;
  
  cVar1 = cursor->stack[(long)cursor->n + -1].type[1].backend;
  if (cVar1 == 2) {
    iVar2 = coda_ascii_cursor_read_string(cursor,dst,dst_size);
    return iVar2;
  }
  if (cVar1 == 3) {
    memcpy(&cStack_328,cursor,0x310);
    iVar2 = coda_cursor_use_base_type_of_special_type(&cStack_328);
    iVar3 = -1;
    if (iVar2 == 0) {
      iVar3 = coda_cursor_read_string(&cStack_328,dst,dst_size);
    }
    return iVar3;
  }
  __assert_fail("type->tag == tag_mem_data",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                ,0x246,"int coda_mem_cursor_read_string(const coda_cursor *, char *, long)");
}

Assistant:

int coda_mem_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_mem_data *type = (coda_mem_data *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_special)
    {
        coda_cursor sub_cursor = *cursor;

        if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_read_string(&sub_cursor, dst, dst_size);
    }

    assert(type->tag == tag_mem_data);
    return coda_ascii_cursor_read_string(cursor, dst, dst_size);
}